

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::internal::ExtensionSet::InternalSerializeMessageSetWithCachedSizesToArray
          (ExtensionSet *this,uint8 *target,EpsCopyOutputStream *stream)

{
  _Rb_tree_node_base *p_Var1;
  _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_> it;
  long lVar2;
  KeyValue *it_1;
  KeyValue *pKVar3;
  uint8 *local_30;
  anon_class_16_2_d2ac9ea8 local_28;
  
  pKVar3 = (this->map_).flat;
  local_30 = target;
  local_28.stream = stream;
  if (this->flat_capacity_ < 0x101) {
    local_28.target = &local_30;
    for (lVar2 = (ulong)this->flat_size_ << 5; lVar2 != 0; lVar2 = lVar2 + -0x20) {
      InternalSerializeMessageSetWithCachedSizesToArray::anon_class_16_2_d2ac9ea8::operator()
                (&local_28,pKVar3->first,&pKVar3->second);
      pKVar3 = pKVar3 + 1;
    }
  }
  else {
    local_28.target = &local_30;
    for (p_Var1 = (_Rb_tree_node_base *)(pKVar3->second).descriptor;
        p_Var1 != (_Rb_tree_node_base *)&pKVar3->second;
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
      InternalSerializeMessageSetWithCachedSizesToArray::anon_class_16_2_d2ac9ea8::operator()
                (&local_28,p_Var1[1]._M_color,(Extension *)&p_Var1[1]._M_parent);
    }
  }
  return local_30;
}

Assistant:

uint8* ExtensionSet::InternalSerializeMessageSetWithCachedSizesToArray(
    uint8* target, io::EpsCopyOutputStream* stream) const {
  ForEach([&target, stream](int number, const Extension& ext) {
    target = ext.InternalSerializeMessageSetItemWithCachedSizesToArray(
        number, target, stream);
  });
  return target;
}